

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
::setCapacity(Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
              *this,size_t newSize)

{
  Entry *pEVar1;
  RemoveConst<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
  *pRVar2;
  Entry *pEVar3;
  ulong uVar4;
  __off_t in_RDX;
  ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
  newBuilder;
  ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
  local_38;
  
  uVar4 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 4) * -0x5555555555555555;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
    ::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                    (0x30,0,newSize,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_38.pos = local_38.ptr;
  local_38.pos = kj::_::
                 CopyConstructArray_<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,_kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry_*,_true,_false>
                 ::apply(local_38.ptr,(this->builder).ptr,(this->builder).pos);
  ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
  ::operator=(&this->builder,&local_38);
  pEVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pEVar1 = local_38.ptr;
  if (local_38.ptr != (Entry *)0x0) {
    local_38.ptr = (Entry *)0x0;
    local_38.pos = (RemoveConst<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
                    *)0x0;
    local_38.endPtr = (Entry *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pEVar1,0x30,
               ((long)pRVar2 - (long)pEVar1 >> 4) * -0x5555555555555555,
               ((long)pEVar3 - (long)pEVar1 >> 4) * -0x5555555555555555,
               ArrayDisposer::
               Dispose_<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
               ::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }